

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O2

size_t ans_byte_compress(void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  long lVar1;
  ulong uVar2;
  uint64_t state_d;
  uint64_t state_c;
  uint64_t state_b;
  uint64_t state_a;
  ans_byte_encode ans_frame;
  long *local_1270;
  uint64_t local_1268;
  uint64_t local_1260;
  uint64_t local_1258;
  uint64_t local_1250;
  void *local_1248;
  ans_byte_encode local_1240;
  
  ans_byte_encode::create(&local_1240,(uint8_t *)src,srcSize);
  local_1270 = (long *)dst;
  local_1248 = dst;
  ans_byte_encode::serialize(&local_1240,(uint8_t **)&local_1270);
  local_1250 = local_1240.lower_bound;
  local_1258 = local_1240.lower_bound;
  local_1260 = local_1240.lower_bound;
  local_1268 = local_1240.lower_bound;
  for (lVar1 = 0; -lVar1 != (ulong)((uint)srcSize & 3); lVar1 = lVar1 + -1) {
    ans_byte_encode::encode_symbol
              (&local_1240,&local_1250,*(uint8_t *)((long)src + lVar1 + (srcSize - 1)),
               (uint8_t **)&local_1270);
  }
  for (uVar2 = srcSize & 0xfffffffffffffffc; uVar2 != 0; uVar2 = uVar2 - 4) {
    ans_byte_encode::encode_symbol
              (&local_1240,&local_1250,*(uint8_t *)((long)src + (uVar2 - 1)),(uint8_t **)&local_1270
              );
    ans_byte_encode::encode_symbol
              (&local_1240,&local_1258,*(uint8_t *)((long)src + (uVar2 - 2)),(uint8_t **)&local_1270
              );
    ans_byte_encode::encode_symbol
              (&local_1240,&local_1260,*(uint8_t *)((long)src + (uVar2 - 3)),(uint8_t **)&local_1270
              );
    ans_byte_encode::encode_symbol
              (&local_1240,&local_1268,*(uint8_t *)((long)src + (uVar2 - 4)),(uint8_t **)&local_1270
              );
  }
  *local_1270 = local_1250 - local_1240.lower_bound;
  local_1270[1] = local_1258 - local_1240.lower_bound;
  local_1270[2] = local_1260 - local_1240.lower_bound;
  local_1270[3] = local_1268 - local_1240.lower_bound;
  return (long)local_1270 + (0x20 - (long)local_1248);
}

Assistant:

size_t ans_byte_compress(
    void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    auto in_u8 = reinterpret_cast<const uint8_t*>(src);
    auto ans_frame = ans_byte_encode::create(in_u8, srcSize);
    uint8_t* out_u8 = reinterpret_cast<uint8_t*>(dst);

    // serialize model
    ans_frame.serialize(out_u8);

    // start encoding
    uint64_t state_a = ans_frame.initial_state();
    uint64_t state_b = ans_frame.initial_state();
    uint64_t state_c = ans_frame.initial_state();
    uint64_t state_d = ans_frame.initial_state();

    size_t cur_sym = 0;
    while ((srcSize - cur_sym) % 4 != 0) {
        ans_frame.encode_symbol(state_a, in_u8[srcSize - cur_sym - 1], out_u8);
        cur_sym += 1;
    }
    while (cur_sym != srcSize) {
        ans_frame.encode_symbol(state_a, in_u8[srcSize - cur_sym - 1], out_u8);
        ans_frame.encode_symbol(state_b, in_u8[srcSize - cur_sym - 2], out_u8);
        ans_frame.encode_symbol(state_c, in_u8[srcSize - cur_sym - 3], out_u8);
        ans_frame.encode_symbol(state_d, in_u8[srcSize - cur_sym - 4], out_u8);
        cur_sym += 4;
    }

    // flush final state
    ans_frame.flush_state(state_a, out_u8);
    ans_frame.flush_state(state_b, out_u8);
    ans_frame.flush_state(state_c, out_u8);
    ans_frame.flush_state(state_d, out_u8);

    return out_u8 - reinterpret_cast<uint8_t*>(dst);
}